

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

ptls_hash_context_t * sha256_create(void)

{
  sha256_context_t_conflict *ctx;
  
  ctx = (sha256_context_t_conflict *)malloc(0x80);
  if (ctx == (sha256_context_t_conflict *)0x0) {
    ctx = (sha256_context_t_conflict *)0x0;
  }
  else {
    (ctx->super).update = sha256_update;
    (ctx->super).final = sha256_final;
    SHA256_Init((SHA256_CTX *)&ctx->ctx);
  }
  return &ctx->super;
}

Assistant:

static ptls_hash_context_t *sha256_create(void)
{
    struct sha256_context_t *ctx;

    if ((ctx = malloc(sizeof(*ctx))) == NULL)
        return NULL;
    ctx->super = (ptls_hash_context_t){sha256_update, sha256_final};
    cf_sha256_init(&ctx->ctx);
    return &ctx->super;
}